

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

float linear_kernel(flat_example *fec1,flat_example *fec2)

{
  float fVar1;
  ulong uVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  float *pfVar5;
  long in_RSI;
  long in_RDI;
  bool bVar6;
  uint64_t ec2pos;
  uint64_t ec1pos;
  size_t idx2;
  size_t idx1;
  int numint;
  features *fs_2;
  features *fs_1;
  float dotprod;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_1c;
  undefined4 local_4;
  
  local_1c = 0.0;
  sVar3 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(in_RSI + 0x80));
  if (sVar3 == 0) {
    local_4 = 0.0;
  }
  else {
    local_40 = 0;
    local_48 = 0;
    while( true ) {
      sVar3 = features::size((features *)0x2c91d9);
      bVar6 = false;
      if (local_40 < sVar3) {
        sVar3 = features::size((features *)0x2c9200);
        bVar6 = local_48 < sVar3;
      }
      if (!bVar6) break;
      puVar4 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(in_RDI + 0x80),local_40);
      uVar2 = *puVar4;
      puVar4 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)(in_RSI + 0x80),local_48);
      local_58 = *puVar4;
      if (local_58 <= uVar2) {
        while( true ) {
          bVar6 = false;
          if (local_58 < uVar2) {
            local_48 = local_48 + 1;
            sVar3 = features::size((features *)0x2c9297);
            bVar6 = local_48 < sVar3;
          }
          if (!bVar6) break;
          puVar4 = v_array<unsigned_long>::operator[]
                             ((v_array<unsigned_long> *)(in_RSI + 0x80),local_48);
          local_58 = *puVar4;
        }
        if (uVar2 == local_58) {
          pfVar5 = v_array<float>::operator[]((v_array<float> *)(in_RDI + 0x60),local_40);
          fVar1 = *pfVar5;
          pfVar5 = v_array<float>::operator[]((v_array<float> *)(in_RSI + 0x60),local_48);
          local_1c = fVar1 * *pfVar5 + local_1c;
          local_48 = local_48 + 1;
        }
      }
      local_40 = local_40 + 1;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

float linear_kernel(const flat_example* fec1, const flat_example* fec2)
{
  float dotprod = 0;

  features& fs_1 = (features&)fec1->fs;
  features& fs_2 = (features&)fec2->fs;
  if (fs_2.indicies.size() == 0)
    return 0.f;

  int numint = 0;
  for (size_t idx1 = 0, idx2 = 0; idx1 < fs_1.size() && idx2 < fs_2.size(); idx1++)
  {
    uint64_t ec1pos = fs_1.indicies[idx1];
    uint64_t ec2pos = fs_2.indicies[idx2];
    // params.all->opts_n_args.trace_message<<ec1pos<<" "<<ec2pos<<" "<<idx1<<" "<<idx2<<" "<<f->x<<" "<<ec2f->x<<endl;
    if (ec1pos < ec2pos)
      continue;

    while (ec1pos > ec2pos && ++idx2 < fs_2.size()) ec2pos = fs_2.indicies[idx2];

    if (ec1pos == ec2pos)
    {
      // params.all->opts_n_args.trace_message<<ec1pos<<" "<<ec2pos<<" "<<idx1<<" "<<idx2<<" "<<f->x<<"
      // "<<ec2f->x<<endl;
      numint++;
      dotprod += fs_1.values[idx1] * fs_2.values[idx2];
      ++idx2;
    }
  }
  // params.all->opts_n_args.trace_message<<endl;
  // params.all->opts_n_args.trace_message<<"numint = "<<numint<<" dotprod = "<<dotprod<<endl;
  return dotprod;
}